

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_b9e812::AV1FrameSizeTests::~AV1FrameSizeTests(AV1FrameSizeTests *this)

{
  code *pcVar1;
  AV1FrameSizeTests *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~AV1FrameSizeTests() override = default;